

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O1

void __thiscall
amrex::CellConservativeLinear::interp
          (CellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,
          int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int param_11,int param_12,
          RunOn runon)

{
  pointer pBVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  pointer pBVar16;
  double dVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  int koff;
  int iVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  uint uVar52;
  long lVar53;
  ulong uVar54;
  int iVar55;
  long lVar56;
  double *pdVar57;
  double *pdVar58;
  uint uVar59;
  long lVar60;
  ulong uVar61;
  int iVar62;
  double *pdVar63;
  uint uVar64;
  long lVar65;
  double *pdVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  double *pdVar70;
  long lVar71;
  double *pdVar72;
  long lVar73;
  ulong uVar74;
  int *piVar75;
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  Box result;
  AsyncArray<amrex::BCRec,_0> async_bcr;
  Elixir cceli;
  FArrayBox ccfab;
  long local_428;
  long local_420;
  ulong local_418;
  int local_404;
  int local_3f4;
  ulong local_3f0;
  double *local_3e8;
  double *local_3e0;
  ulong local_3d0;
  double *local_3a8;
  double *local_3a0;
  double *local_398;
  double *local_380;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  Box local_1d8;
  double *local_1b8;
  double dStack_1b0;
  double *local_1a8;
  double dStack_1a0;
  long local_198;
  ulong local_190;
  double *local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  ulong local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  AsyncArray<amrex::BCRec,_0> local_c8;
  undefined1 local_b8 [16];
  pointer local_a8;
  BaseFab<double> local_98;
  undefined1 local_4c [8];
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined8 uStack_38;
  
  uVar74 = (ulong)(uint)ncomp;
  pdVar15 = (crse->super_BaseFab<double>).dptr;
  uVar4 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar23 = (long)(int)uVar4;
  uVar5 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar40 = (long)(int)uVar5;
  uVar6 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  iVar38 = (crse->super_BaseFab<double>).domain.bigend.vect[0];
  iVar7 = (crse->super_BaseFab<double>).domain.bigend.vect[1];
  iVar8 = (crse->super_BaseFab<double>).domain.bigend.vect[2];
  local_188 = (fine->super_BaseFab<double>).dptr;
  local_178 = (long)(fine->super_BaseFab<double>).domain.smallend.vect[0];
  local_170 = (long)(fine->super_BaseFab<double>).domain.smallend.vect[1];
  iVar9 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  iVar10 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
  iVar11 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
  iVar34 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  (*(this->super_Interpolater).super_InterpBase._vptr_InterpBase[3])
            (local_4c,this,fine_region,ratio);
  local_1d8.bigend.vect[2] = (int)uStack_38;
  local_1d8.btype.itype = (uint)((ulong)uStack_38 >> 0x20);
  local_1d8.smallend.vect[0] = local_4c._0_4_;
  local_1d8.smallend.vect[1] = local_4c._4_4_;
  local_1d8.smallend.vect[0] = local_1d8.smallend.vect[0] + 1;
  local_1d8.smallend.vect[1] = local_1d8.smallend.vect[1] + 1;
  local_1d8.smallend.vect[2] = iStack_44 + 1;
  local_1d8.bigend.vect[0] = iStack_40 + -1;
  local_1d8.bigend.vect[1] = iStack_3c + -1;
  local_1d8.bigend.vect[2] = local_1d8.bigend.vect[2] + -1;
  local_c8.d_data = (BCRec *)0x0;
  local_c8.h_data = (BCRec *)0x0;
  pBVar16 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  FArrayBox::FArrayBox((FArrayBox *)&local_98,&local_1d8,ncomp * 3,true,false,(Arena *)0x0);
  iVar38 = iVar38 + 1;
  iVar32 = iVar7 + 1;
  lVar69 = (long)(int)(iVar38 - uVar4);
  local_120 = (long)(int)(iVar32 - uVar5);
  lVar47 = local_120 * lVar69;
  lVar28 = (long)(int)((iVar8 - uVar6) + 1);
  lVar48 = lVar47 * lVar28;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (pointer)0x0;
  lVar60 = (long)local_98.domain.smallend.vect[0];
  lVar65 = (long)local_98.domain.smallend.vect[2];
  lVar56 = (long)((local_98.domain.bigend.vect[0] - local_98.domain.smallend.vect[0]) + 1);
  local_198 = (long)((local_98.domain.bigend.vect[1] - local_98.domain.smallend.vect[1]) + 1);
  local_180 = local_198 * lVar56;
  lVar49 = (long)((local_98.domain.bigend.vect[2] - local_98.domain.smallend.vect[2]) + 1);
  lVar24 = local_180 * lVar49;
  if (this->do_linear_limiting == false) {
    if (0 < ncomp) {
      iVar7 = (crse_geom->domain).smallend.vect[2];
      iVar12 = (crse_geom->domain).bigend.vect[2];
      iVar13 = ratio->vect[1];
      iVar20 = (crse_geom->domain).bigend.vect[1];
      iVar36 = (crse_geom->domain).bigend.vect[0];
      iVar14 = (crse_geom->domain).smallend.vect[1];
      iVar33 = (crse_geom->domain).smallend.vect[0];
      local_1a8 = (double *)(double)(ratio->vect[0] + -1);
      dStack_1a0 = (double)(ratio->vect[2] + -1);
      local_1b8 = (double *)(double)(ratio->vect[0] * 2);
      dStack_1b0 = (double)(ratio->vect[2] * 2);
      local_3d0 = 0;
      do {
        if (local_1d8.smallend.vect[2] <= local_1d8.bigend.vect[2]) {
          iVar55 = (int)local_3d0;
          pBVar1 = pBVar16 + local_3d0;
          lVar28 = (crse_comp + iVar55) * lVar48;
          iVar19 = local_1d8.smallend.vect[2];
          do {
            if (local_1d8.smallend.vect[1] <= local_1d8.bigend.vect[1]) {
              iVar62 = iVar19 - uVar6;
              lVar65 = lVar47 * iVar62;
              lVar49 = (iVar19 - local_98.domain.smallend.vect[2]) * local_180;
              local_420 = (long)local_1d8.smallend.vect[1];
              do {
                if (local_1d8.smallend.vect[0] <= local_1d8.bigend.vect[0]) {
                  lVar30 = (local_420 - lVar40) * lVar69;
                  lVar31 = (local_420 - local_98.domain.smallend.vect[1]) * lVar56;
                  lVar53 = (long)local_1d8.smallend.vect[0];
                  lVar71 = (ulong)(~uVar4 + local_1d8.smallend.vect[0]) << 0x20;
                  do {
                    iVar26 = (int)(lVar53 + 1);
                    dVar85 = pdVar15[lVar30 + lVar65 + lVar28 + (int)(iVar26 - uVar4)];
                    dVar82 = pdVar15[lVar30 + lVar65 + lVar28 + (int)(~uVar4 + (int)lVar53)];
                    dVar86 = (dVar85 - dVar82) * 0.5;
                    if ((lVar53 == iVar33) && (pBVar1->bc[0] - 3U < 2)) {
                      if (lVar53 + 2 < (long)iVar38) {
                        dVar86 = pdVar15[lVar30 + lVar65 + lVar28 + ((lVar53 + 2) - lVar23)] * -0.1
                                 + dVar85 * 0.6666666666666666 +
                                   dVar82 * -1.0666666666666667 +
                                   pdVar15[lVar30 + lVar65 + lVar28 + (lVar53 - lVar23)] * 0.5;
                      }
                      else {
                        dVar86 = (dVar82 * -6.0 +
                                 pdVar15[lVar30 + lVar65 + lVar28 + (lVar53 - lVar23)] * 5.0 +
                                 dVar85) * 0.25;
                      }
                    }
                    if ((lVar53 == iVar36) && (pBVar1->bc[3] - 3U < 2)) {
                      if (lVar53 + -2 < lVar23) {
                        dVar86 = (dVar85 * -6.0 +
                                 pdVar15[lVar30 + lVar65 + lVar28 + (lVar53 - lVar23)] * 5.0 +
                                 dVar82) * -0.25;
                      }
                      else {
                        dVar86 = pdVar15[lVar30 + lVar65 + lVar28 + ((lVar53 + -2) - lVar23)] * 0.1
                                 + dVar82 * -0.6666666666666666 +
                                   dVar85 * 1.0666666666666667 +
                                   pdVar15[lVar30 + lVar65 + lVar28 + (lVar53 - lVar23)] * -0.5;
                      }
                    }
                    lVar73 = lVar53 - lVar23;
                    dVar79 = pdVar15[lVar30 + lVar73 + lVar65 + lVar28];
                    dVar82 = (dVar79 - dVar82) + (dVar79 - dVar82);
                    dVar84 = (dVar85 - dVar79) + (dVar85 - dVar79);
                    dVar85 = 0.0;
                    if (0.0 <= dVar84 * dVar82) {
                      dVar85 = ABS(dVar82);
                      dVar84 = ABS(dVar84);
                      if (dVar84 <= dVar85) {
                        dVar85 = dVar84;
                      }
                    }
                    dVar82 = pdVar15[lVar28 + lVar65 + (int)(((int)local_420 - uVar5) + 1) * lVar69
                                                       + lVar73];
                    dVar84 = pdVar15[lVar28 + lVar65 + (int)(~uVar5 + (int)local_420) * lVar69 +
                                                       lVar73];
                    dVar80 = (dVar82 - dVar84) * 0.5;
                    if ((local_420 == iVar14) && (pBVar1->bc[1] - 3U < 2)) {
                      if (local_420 + 2 < (long)iVar32) {
                        dVar80 = pdVar15[lVar28 + lVar65 + ((local_420 + 2) - lVar40) * lVar69 +
                                                           lVar73] * -0.1 +
                                 dVar82 * 0.6666666666666666 +
                                 dVar84 * -1.0666666666666667 + dVar79 * 0.5;
                      }
                      else {
                        dVar80 = (dVar84 * -6.0 + dVar79 * 5.0 + dVar82) * 0.25;
                      }
                    }
                    if ((local_420 == iVar20) && (pBVar1->bc[4] - 3U < 2)) {
                      if (local_420 + -2 < lVar40) {
                        dVar80 = (dVar82 * -6.0 + dVar79 * 5.0 + dVar84) * -0.25;
                      }
                      else {
                        dVar80 = pdVar15[lVar28 + lVar65 + ((local_420 + -2) - lVar40) * lVar69 +
                                                           lVar73] * 0.1 +
                                 dVar84 * -0.6666666666666666 +
                                 dVar82 * 1.0666666666666667 + dVar79 * -0.5;
                      }
                    }
                    dVar84 = (dVar79 - dVar84) + (dVar79 - dVar84);
                    dVar83 = (dVar82 - dVar79) + (dVar82 - dVar79);
                    dVar82 = 0.0;
                    if (0.0 <= dVar83 * dVar84) {
                      dVar82 = ABS(dVar84);
                      dVar83 = ABS(dVar83);
                      if (dVar83 <= dVar82) {
                        dVar82 = dVar83;
                      }
                    }
                    dVar84 = pdVar15[lVar30 + lVar73 + (iVar62 + 1) * lVar47 + lVar28];
                    dVar83 = pdVar15[lVar30 + lVar73 + (int)(~uVar6 + iVar19) * lVar47 + lVar28];
                    dVar81 = (dVar84 - dVar83) * 0.5;
                    if ((iVar7 == iVar19) && (pBVar1->bc[2] - 3U < 2)) {
                      if (iVar8 < iVar19 + 2) {
                        dVar81 = (dVar83 * -6.0 + dVar79 * 5.0 + dVar84) * 0.25;
                      }
                      else {
                        dVar81 = pdVar15[lVar30 + lVar73 + (int)((iVar19 + 2) - uVar6) * lVar47 +
                                                           lVar28] * -0.1 +
                                 dVar84 * 0.6666666666666666 +
                                 dVar83 * -1.0666666666666667 + dVar79 * 0.5;
                      }
                    }
                    if ((iVar12 == iVar19) && (pBVar1->bc[5] - 3U < 2)) {
                      if (iVar19 + -2 < (int)uVar6) {
                        dVar81 = (dVar84 * -6.0 + dVar79 * 5.0 + dVar83) * -0.25;
                      }
                      else {
                        dVar81 = pdVar15[lVar30 + lVar73 + (int)((iVar19 + -2) - uVar6) * lVar47 +
                                                           lVar28] * 0.1 +
                                 dVar83 * -0.6666666666666666 +
                                 dVar84 * 1.0666666666666667 + dVar79 * -0.5;
                      }
                    }
                    dVar83 = (dVar79 - dVar83) + (dVar79 - dVar83);
                    dVar17 = (dVar84 - dVar79) + (dVar84 - dVar79);
                    dVar84 = 0.0;
                    if (0.0 <= dVar17 * dVar83) {
                      dVar84 = ABS(dVar83);
                      dVar17 = ABS(dVar17);
                      if (dVar17 <= dVar84) {
                        dVar84 = dVar17;
                      }
                    }
                    dVar83 = ABS(dVar86);
                    if (dVar85 <= ABS(dVar86)) {
                      dVar83 = dVar85;
                    }
                    dVar83 = dVar83 * (double)((ulong)dVar86 & 0x8000000000000000 |
                                              0x3ff0000000000000);
                    dVar85 = ABS(dVar80);
                    if (dVar82 <= ABS(dVar80)) {
                      dVar85 = dVar82;
                    }
                    dVar85 = dVar85 * (double)((ulong)dVar80 & 0x8000000000000000 |
                                              0x3ff0000000000000);
                    dVar82 = ABS(dVar81);
                    if (dVar84 <= ABS(dVar81)) {
                      dVar82 = dVar84;
                    }
                    dVar82 = dVar82 * (double)((ulong)dVar81 & 0x8000000000000000 |
                                              0x3ff0000000000000);
                    if ((((dVar83 != 0.0) || (NAN(dVar83))) || (dVar85 != 0.0)) || (NAN(dVar85))) {
LAB_005b42a7:
                      lVar73 = -1;
                      dVar84 = dVar79;
                      dVar86 = dVar79;
                      do {
                        lVar67 = -1;
                        do {
                          lVar41 = 3;
                          lVar51 = lVar71;
                          dVar80 = dVar84;
                          dVar81 = dVar86;
                          do {
                            dVar86 = *(double *)
                                      ((long)pdVar15 +
                                      (lVar51 >> 0x1d) +
                                      ((int)lVar67 + (int)(local_420 - lVar40)) * lVar69 * 8 +
                                      (iVar62 + (int)lVar73) * lVar47 * 8 + lVar28 * 8);
                            dVar84 = dVar86;
                            if (dVar80 <= dVar86) {
                              dVar84 = dVar80;
                            }
                            if (dVar86 <= dVar81) {
                              dVar86 = dVar81;
                            }
                            lVar51 = lVar51 + 0x100000000;
                            lVar41 = lVar41 + -1;
                            dVar80 = dVar84;
                            dVar81 = dVar86;
                          } while (lVar41 != 0);
                          lVar67 = lVar67 + 1;
                        } while (lVar67 != 2);
                        lVar73 = lVar73 + 1;
                      } while (lVar73 != 2);
                      auVar77._0_8_ = ABS(dVar83) * (double)local_1a8;
                      auVar77._8_8_ = ABS(dVar82) * dStack_1a0;
                      auVar78._8_8_ = dStack_1b0;
                      auVar78._0_8_ = local_1b8;
                      auVar78 = divpd(auVar77,auVar78);
                      dVar80 = auVar78._8_8_ +
                               (ABS(dVar85) * (double)(iVar13 + -1)) / (double)(iVar13 * 2) +
                               auVar78._0_8_;
                      uVar37 = -(ulong)(dVar86 - dVar79 < dVar80);
                      dVar86 = (double)(~uVar37 & 0x3ff0000000000000 |
                                       (ulong)((dVar86 - dVar79) / dVar80) & uVar37);
                      uVar37 = -(ulong)(dVar79 - dVar84 < dVar86 * dVar80);
                      dVar86 = (double)(uVar37 & (ulong)((dVar79 - dVar84) / dVar80) |
                                       ~uVar37 & (ulong)dVar86);
                    }
                    else {
                      dVar86 = 1.0;
                      if ((dVar82 != 0.0) || (NAN(dVar82))) goto LAB_005b42a7;
                    }
                    lVar73 = lVar53 - lVar60;
                    local_98.dptr[lVar49 + lVar31 + lVar73 + local_3d0 * lVar24] = dVar83 * dVar86;
                    local_98.dptr[lVar49 + lVar31 + lVar73 + (ncomp + iVar55) * lVar24] =
                         dVar85 * dVar86;
                    local_98.dptr[lVar49 + lVar31 + lVar73 + (ncomp * 2 + iVar55) * lVar24] =
                         dVar82 * dVar86;
                    lVar71 = lVar71 + 0x100000000;
                    lVar53 = lVar53 + 1;
                  } while (local_1d8.bigend.vect[0] + 1 != iVar26);
                }
                local_420 = local_420 + 1;
              } while (local_1d8.bigend.vect[1] + 1 != (int)local_420);
            }
            bVar76 = iVar19 != local_1d8.bigend.vect[2];
            iVar19 = iVar19 + 1;
          } while (bVar76);
        }
        local_3d0 = local_3d0 + 1;
      } while (local_3d0 != uVar74);
    }
  }
  else if (local_1d8.smallend.vect[2] <= local_1d8.bigend.vect[2]) {
    iVar32 = (crse_geom->domain).smallend.vect[1];
    iVar12 = (crse_geom->domain).smallend.vect[2];
    iVar13 = (crse_geom->domain).bigend.vect[1];
    iVar20 = (crse_geom->domain).bigend.vect[2];
    lVar53 = (long)local_1d8.smallend.vect[0];
    local_108 = local_98.dptr + -lVar60;
    local_130 = (ulong)(uint)(ncomp * 2) * lVar49 * 8 + lVar65 * -8;
    local_128 = lVar49 * uVar74 * 8 + lVar65 * -8;
    local_110 = pdVar15 + -lVar23;
    local_138 = crse_comp * lVar28 * 8;
    local_140 = local_138 + (long)(int)uVar6 * -8;
    iVar36 = (crse_geom->domain).bigend.vect[0];
    iVar14 = (crse_geom->domain).smallend.vect[0];
    local_148 = (long)local_98.domain.smallend.vect[1] * -8;
    local_150 = -lVar65;
    local_158 = lVar40 * -8;
    iVar33 = local_1d8.smallend.vect[2] - uVar6;
    local_310 = iVar33 + -1;
    local_190 = (ulong)(uint)local_1d8.smallend.vect[1];
    uVar42 = (local_1d8.smallend.vect[1] - uVar5) + 1;
    local_160 = (ulong)uVar42;
    local_118 = local_98.dptr + (lVar53 - lVar60);
    local_168 = local_198 * 8;
    local_314 = local_1d8.smallend.vect[2] + 2;
    local_318 = local_1d8.smallend.vect[2] + -2;
    iVar19 = local_1d8.smallend.vect[2];
    do {
      iVar33 = iVar33 + 1;
      if (local_1d8.smallend.vect[1] <= local_1d8.bigend.vect[1]) {
        lVar28 = (long)iVar19;
        local_d8 = (local_140 + lVar28 * 8) * local_120;
        local_d0 = (local_150 + lVar28) * local_168 + local_148;
        local_100 = local_158 + local_d8;
        local_e0 = (local_140 + (long)local_314 * 8) * local_120 + local_158;
        local_e8 = (local_140 + (long)local_318 * 8) * local_120 + local_158;
        local_f0 = (local_138 + (long)local_310 * 8) * local_120 + local_158;
        local_f8 = (local_138 + (long)iVar33 * 8) * local_120 + local_158;
        local_418 = local_190;
        local_404 = (local_1d8.smallend.vect[1] - uVar5) + -1;
        uVar3 = uVar42;
        iVar62 = local_1d8.smallend.vect[1] - 2;
        iVar55 = local_1d8.smallend.vect[1] + 2;
        do {
          iVar26 = (int)local_418;
          if (local_1d8.smallend.vect[0] <= local_1d8.bigend.vect[0]) {
            lVar49 = (long)iVar26;
            lVar60 = ((local_130 + lVar28 * 8) * local_198 + local_148 + lVar49 * 8) * lVar56;
            pdVar58 = (double *)((long)local_118 + lVar60);
            lVar65 = ((local_128 + lVar28 * 8) * local_198 + local_148 + lVar49 * 8) * lVar56;
            lVar40 = (local_d0 + lVar49 * 8) * lVar56;
            local_290 = (double *)(lVar60 + (long)local_108);
            local_298 = (double *)(lVar65 + (long)local_108);
            local_2a0 = (double *)(lVar40 + (long)local_108);
            lVar60 = (local_100 + lVar49 * 8) * lVar69;
            local_2a8 = (double *)((local_100 + (long)iVar55 * 8) * lVar69 + (long)local_110);
            local_2b0 = (double *)((local_100 + (long)iVar62 * 8) * lVar69 + (long)local_110);
            local_2b8 = (double *)((local_e0 + lVar49 * 8) * lVar69 + (long)local_110);
            local_2c0 = (double *)((local_e8 + lVar49 * 8) * lVar69 + (long)local_110);
            local_2c8 = (double *)((local_f0 + lVar49 * 8) * lVar69 + (long)local_110);
            local_2d0 = (double *)((local_f8 + lVar49 * 8) * lVar69 + (long)local_110);
            local_2d8 = (double *)((local_d8 + (long)local_404 * 8) * lVar69 + (long)local_110);
            local_380 = (double *)((local_d8 + (long)(int)uVar3 * 8) * lVar69 + (long)local_110);
            local_2e0 = (double *)((long)local_110 + lVar60);
            pdVar25 = (double *)((long)local_118 + lVar65);
            pdVar29 = (double *)((long)local_118 + lVar40);
            local_428 = lVar53;
            iVar2 = ~uVar4 + local_1d8.smallend.vect[0];
            local_3f4 = local_1d8.smallend.vect[0] - uVar4;
            do {
              local_1b8 = pdVar29;
              local_1a8 = pdVar25;
              local_3f4 = local_3f4 + 1;
              dVar86 = 1.0;
              dVar85 = 1.0;
              dVar82 = 1.0;
              if (0 < ncomp) {
                local_398 = local_2c0;
                local_3e0 = local_2b8;
                local_3a0 = local_2b0;
                local_3a8 = local_2a8;
                dVar86 = 1.0;
                pdVar25 = local_2d8;
                pdVar29 = (double *)(lVar60 + (long)pdVar15);
                uVar37 = uVar74;
                pdVar39 = local_2a0;
                pdVar50 = local_2e0;
                pdVar57 = local_2d0;
                pdVar63 = local_298;
                pdVar66 = local_290;
                pdVar70 = local_380;
                pdVar72 = local_2c8;
                piVar75 = pBVar16->bc + 5;
                dVar79 = 1.0;
                dVar84 = 1.0;
                do {
                  dVar85 = pdVar29[local_3f4];
                  dVar82 = pdVar29[iVar2];
                  dVar80 = (dVar85 - dVar82) * 0.5;
                  if ((local_428 == iVar14) && (((BCRec *)(piVar75 + -5))->bc[0] - 3U < 2)) {
                    if (local_428 + 2 < (long)iVar38) {
                      dVar80 = pdVar50[lVar53 + 2] * -0.1 +
                               dVar85 * 0.6666666666666666 +
                               dVar82 * -1.0666666666666667 + pdVar50[lVar53] * 0.5;
                    }
                    else {
                      dVar80 = (dVar82 * -6.0 + pdVar50[lVar53] * 5.0 + dVar85) * 0.25;
                    }
                  }
                  if ((local_428 == iVar36) && (piVar75[-2] - 3U < 2)) {
                    if (local_428 + -2 < lVar23) {
                      dVar80 = (dVar85 * -6.0 + pdVar50[lVar53] * 5.0 + dVar82) * -0.25;
                    }
                    else {
                      dVar80 = pdVar50[lVar53 + -2] * 0.1 +
                               dVar82 * -0.6666666666666666 +
                               dVar85 * 1.0666666666666667 + pdVar50[lVar53] * -0.5;
                    }
                  }
                  dVar82 = pdVar50[lVar53] - dVar82;
                  dVar85 = dVar85 - pdVar50[lVar53];
                  dVar82 = dVar82 + dVar82;
                  dVar85 = dVar85 + dVar85;
                  dVar83 = 0.0;
                  if (0.0 <= dVar85 * dVar82) {
                    dVar83 = ABS(dVar82);
                    dVar85 = ABS(dVar85);
                    if (dVar85 <= dVar83) {
                      dVar83 = dVar85;
                    }
                  }
                  if ((dVar80 != 0.0) || (dVar85 = dVar86, NAN(dVar80))) {
                    dVar85 = ABS(dVar80);
                    if (dVar83 <= ABS(dVar80)) {
                      dVar85 = dVar83;
                    }
                    dVar85 = (dVar85 * (double)((ulong)dVar80 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar80;
                    if (dVar86 <= dVar85) {
                      dVar85 = dVar86;
                    }
                  }
                  dVar86 = dVar85;
                  pdVar39[lVar53] = dVar80;
                  dVar85 = pdVar70[lVar53];
                  dVar82 = pdVar25[lVar53];
                  dVar80 = (dVar85 - dVar82) * 0.5;
                  if ((iVar32 == iVar26) && (piVar75[-4] - 3U < 2)) {
                    if (iVar7 < iVar26 + 2) {
                      dVar80 = (dVar82 * -6.0 + pdVar50[lVar53] * 5.0 + dVar85) * 0.25;
                    }
                    else {
                      dVar80 = local_3a8[lVar53] * -0.1 +
                               dVar85 * 0.6666666666666666 +
                               dVar82 * -1.0666666666666667 + pdVar50[lVar53] * 0.5;
                    }
                  }
                  if ((iVar13 == iVar26) && (piVar75[-1] - 3U < 2)) {
                    if (iVar26 + -2 < (int)uVar5) {
                      dVar80 = (dVar85 * -6.0 + pdVar50[lVar53] * 5.0 + dVar82) * -0.25;
                    }
                    else {
                      dVar80 = local_3a0[lVar53] * 0.1 +
                               dVar82 * -0.6666666666666666 +
                               dVar85 * 1.0666666666666667 + pdVar50[lVar53] * -0.5;
                    }
                  }
                  dVar82 = pdVar50[lVar53] - dVar82;
                  dVar85 = dVar85 - pdVar50[lVar53];
                  dVar82 = dVar82 + dVar82;
                  dVar85 = dVar85 + dVar85;
                  dVar83 = 0.0;
                  if (0.0 <= dVar85 * dVar82) {
                    dVar83 = ABS(dVar82);
                    dVar85 = ABS(dVar85);
                    if (dVar85 <= dVar83) {
                      dVar83 = dVar85;
                    }
                  }
                  if ((dVar80 != 0.0) || (dVar82 = dVar84, NAN(dVar80))) {
                    dVar85 = ABS(dVar80);
                    if (dVar83 <= ABS(dVar80)) {
                      dVar85 = dVar83;
                    }
                    dVar82 = (dVar85 * (double)((ulong)dVar80 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar80;
                    if (dVar84 <= dVar82) {
                      dVar82 = dVar84;
                    }
                  }
                  pdVar63[lVar53] = dVar80;
                  dVar85 = pdVar57[lVar53];
                  dVar84 = pdVar72[lVar53];
                  dVar80 = (dVar85 - dVar84) * 0.5;
                  if ((iVar12 == iVar19) && (piVar75[-3] - 3U < 2)) {
                    if (iVar8 < iVar19 + 2) {
                      dVar80 = (dVar84 * -6.0 + pdVar50[lVar53] * 5.0 + dVar85) * 0.25;
                    }
                    else {
                      dVar80 = local_3e0[lVar53] * -0.1 +
                               dVar85 * 0.6666666666666666 +
                               dVar84 * -1.0666666666666667 + pdVar50[lVar53] * 0.5;
                    }
                  }
                  if ((iVar20 == iVar19) && (*piVar75 - 3U < 2)) {
                    if (iVar19 + -2 < (int)uVar6) {
                      dVar80 = (dVar85 * -6.0 + pdVar50[lVar53] * 5.0 + dVar84) * -0.25;
                    }
                    else {
                      dVar80 = local_398[lVar53] * 0.1 +
                               dVar84 * -0.6666666666666666 +
                               dVar85 * 1.0666666666666667 + pdVar50[lVar53] * -0.5;
                    }
                  }
                  dVar84 = pdVar50[lVar53] - dVar84;
                  dVar85 = dVar85 - pdVar50[lVar53];
                  dVar84 = dVar84 + dVar84;
                  dVar85 = dVar85 + dVar85;
                  dVar83 = 0.0;
                  if (0.0 <= dVar85 * dVar84) {
                    dVar83 = ABS(dVar84);
                    dVar85 = ABS(dVar85);
                    if (dVar85 <= dVar83) {
                      dVar83 = dVar85;
                    }
                  }
                  if ((dVar80 != 0.0) || (dVar85 = dVar79, NAN(dVar80))) {
                    dVar85 = ABS(dVar80);
                    if (dVar83 <= ABS(dVar80)) {
                      dVar85 = dVar83;
                    }
                    dVar85 = (dVar85 * (double)((ulong)dVar80 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar80;
                    if (dVar79 <= dVar85) {
                      dVar85 = dVar79;
                    }
                  }
                  pdVar66[lVar53] = dVar80;
                  pdVar66 = pdVar66 + lVar24;
                  pdVar63 = pdVar63 + lVar24;
                  pdVar39 = pdVar39 + lVar24;
                  piVar75 = piVar75 + 6;
                  pdVar50 = pdVar50 + lVar48;
                  local_3a8 = local_3a8 + lVar48;
                  local_3a0 = local_3a0 + lVar48;
                  local_3e0 = local_3e0 + lVar48;
                  local_398 = local_398 + lVar48;
                  pdVar72 = pdVar72 + lVar48;
                  pdVar57 = pdVar57 + lVar48;
                  pdVar25 = pdVar25 + lVar48;
                  pdVar70 = pdVar70 + lVar48;
                  pdVar29 = pdVar29 + lVar48;
                  uVar37 = uVar37 - 1;
                  dVar79 = dVar85;
                  dVar84 = dVar82;
                } while (uVar37 != 0);
              }
              if (0 < ncomp) {
                lVar40 = 0;
                uVar37 = uVar74;
                do {
                  *(double *)((long)local_1b8 + lVar40) =
                       *(double *)((long)local_1b8 + lVar40) * dVar86;
                  *(double *)((long)local_1a8 + lVar40) =
                       *(double *)((long)local_1a8 + lVar40) * dVar82;
                  *(double *)((long)pdVar58 + lVar40) = *(double *)((long)pdVar58 + lVar40) * dVar85
                  ;
                  lVar40 = lVar40 + lVar24 * 8;
                  uVar37 = uVar37 - 1;
                } while (uVar37 != 0);
              }
              local_428 = local_428 + 1;
              local_290 = local_290 + 1;
              local_298 = local_298 + 1;
              local_2a0 = local_2a0 + 1;
              local_2e0 = local_2e0 + 1;
              local_2a8 = local_2a8 + 1;
              local_2b0 = local_2b0 + 1;
              local_2b8 = local_2b8 + 1;
              local_2c0 = local_2c0 + 1;
              local_2c8 = local_2c8 + 1;
              local_2d0 = local_2d0 + 1;
              local_2d8 = local_2d8 + 1;
              local_380 = local_380 + 1;
              iVar2 = iVar2 + 1;
              pdVar58 = pdVar58 + 1;
              pdVar25 = local_1a8 + 1;
              pdVar29 = local_1b8 + 1;
            } while (local_1d8.bigend.vect[0] + 1 != (int)local_428);
          }
          local_418 = (ulong)(iVar26 + 1);
          iVar55 = iVar55 + 1;
          iVar62 = iVar62 + 1;
          local_404 = local_404 + 1;
          uVar3 = uVar3 + 1;
        } while (iVar26 != local_1d8.bigend.vect[1]);
      }
      local_314 = local_314 + 1;
      local_318 = local_318 + 1;
      local_310 = local_310 + 1;
      bVar76 = iVar19 != local_1d8.bigend.vect[2];
      iVar19 = iVar19 + 1;
    } while (bVar76);
  }
  if (0 < ncomp) {
    lVar23 = (long)((iVar10 - (int)local_178) + 1);
    iVar38 = ratio->vect[0];
    iVar7 = ratio->vect[1];
    iVar8 = ratio->vect[2];
    uVar42 = (fine_region->smallend).vect[2];
    uVar3 = (fine_region->bigend).vect[2];
    iVar10 = (fine_region->bigend).vect[0];
    iVar32 = (fine_region->bigend).vect[1];
    iVar12 = (fine_region->smallend).vect[1];
    uVar68 = (ulong)iVar12;
    iVar13 = (fine_region->smallend).vect[0];
    uVar37 = (ulong)iVar13;
    local_188 = local_188 + (uVar37 - local_178);
    local_1a8 = (double *)((long)((iVar34 - iVar9) + 1) * 8);
    local_1b8 = (double *)(ulong)(uint)(ncomp * 2);
    local_3f0 = 0;
    local_30c = fine_comp;
    do {
      if ((int)uVar42 <= (int)uVar3) {
        iVar34 = (int)local_3f0;
        uVar27 = uVar42;
        do {
          if (iVar12 <= iVar32) {
            local_3e8 = (double *)
                        ((((long)local_30c * (long)local_1a8 + (long)iVar9 * -8 +
                          (long)(int)uVar27 * 8) * (long)((iVar11 - (int)local_170) + 1) +
                         uVar68 * 8 + local_170 * -8) * lVar23 + (long)local_188);
            uVar52 = uVar27 + 1;
            uVar43 = -uVar52;
            if (0 < (int)uVar52) {
              uVar43 = uVar52;
            }
            uVar52 = ~(uVar43 >> 2);
            if (-1 < (int)uVar27) {
              uVar52 = uVar27 >> 2;
            }
            uVar54 = uVar68;
            uVar44 = ~(uVar43 >> 1);
            if (-1 < (int)uVar27) {
              uVar44 = uVar27 >> 1;
            }
            do {
              if (iVar13 <= iVar10) {
                uVar18 = (uint)uVar54;
                uVar35 = uVar18 + 1;
                uVar45 = -uVar35;
                if (0 < (int)uVar35) {
                  uVar45 = uVar35;
                }
                pdVar58 = local_3e8;
                uVar61 = uVar37;
                uVar35 = ~(uVar45 >> 2);
                uVar46 = ~(uVar45 >> 1);
                if (-1 < (long)uVar54) {
                  uVar35 = (uint)(uVar54 >> 2) & 0x3fffffff;
                  uVar46 = (uint)(uVar54 >> 1) & 0x7fffffff;
                }
                do {
                  uVar59 = (uint)uVar61;
                  if (iVar38 == 4) {
                    if ((long)uVar61 < 0) {
                      uVar64 = uVar59 + 1;
                      uVar21 = -uVar64;
                      if (0 < (int)uVar64) {
                        uVar21 = uVar64;
                      }
                      uVar21 = uVar21 >> 2;
LAB_005b4800:
                      uVar21 = ~uVar21;
                    }
                    else {
                      uVar21 = (uint)(uVar61 >> 2) & 0x3fffffff;
                    }
                  }
                  else if (iVar38 == 2) {
                    if ((long)uVar61 < 0) {
                      uVar64 = uVar59 + 1;
                      uVar21 = -uVar64;
                      if (0 < (int)uVar64) {
                        uVar21 = uVar64;
                      }
                      uVar21 = uVar21 >> 1;
                      goto LAB_005b4800;
                    }
                    uVar21 = (uint)(uVar61 >> 1) & 0x7fffffff;
                  }
                  else {
                    uVar21 = uVar59;
                    if (iVar38 != 1) {
                      if ((long)uVar61 < 0) {
                        iVar36 = uVar59 + 1;
                        iVar20 = -iVar36;
                        if (0 < iVar36) {
                          iVar20 = iVar36;
                        }
                        uVar21 = iVar20 / iVar38;
                        goto LAB_005b4800;
                      }
                      uVar21 = (uint)((long)((ulong)(uint)((int)uVar59 >> 0x1f) << 0x20 |
                                            uVar61 & 0xffffffff) / (long)iVar38);
                    }
                  }
                  uVar64 = uVar18;
                  if (((iVar7 != 1) && (uVar64 = uVar35, iVar7 != 4)) &&
                     (uVar64 = uVar46, iVar7 != 2)) {
                    if ((long)uVar54 < 0) {
                      uVar64 = ~((int)uVar45 / iVar7);
                    }
                    else {
                      uVar64 = (uint)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 |
                                            uVar54 & 0xffffffff) / (long)iVar7);
                    }
                  }
                  uVar22 = uVar27;
                  if (((iVar8 != 1) && (uVar22 = uVar52, iVar8 != 4)) &&
                     (uVar22 = uVar44, iVar8 != 2)) {
                    if ((int)uVar27 < 0) {
                      uVar22 = ~((int)uVar43 / iVar8);
                    }
                    else {
                      uVar22 = (int)uVar27 / iVar8;
                    }
                  }
                  lVar40 = (long)(int)(uVar21 - local_98.domain.smallend.vect[0]);
                  lVar49 = (int)(uVar64 - local_98.domain.smallend.vect[1]) * lVar56;
                  lVar28 = (int)(uVar22 - local_98.domain.smallend.vect[2]) * local_180;
                  *pdVar58 = (((double)(int)(uVar27 - uVar22 * iVar8) + 0.5) / (double)iVar8 + -0.5)
                             * local_98.dptr
                               [lVar49 + lVar40 + lVar28 + (ncomp * 2 + iVar34) * lVar24] +
                             (((double)(int)(uVar18 - uVar64 * iVar7) + 0.5) / (double)iVar7 + -0.5)
                             * local_98.dptr[lVar49 + lVar40 + lVar28 + (ncomp + iVar34) * lVar24] +
                             (((double)(int)(-iVar38 * uVar21 + uVar59) + 0.5) / (double)iVar38 +
                             -0.5) * local_98.dptr[lVar49 + lVar40 + lVar28 + local_3f0 * lVar24] +
                             pdVar15[(int)(uVar64 - uVar5) * lVar69 +
                                     (long)(int)(uVar21 - uVar4) +
                                     (int)(uVar22 - uVar6) * lVar47 + (crse_comp + iVar34) * lVar48]
                  ;
                  uVar61 = uVar61 + 1;
                  pdVar58 = pdVar58 + 1;
                } while (iVar10 + 1 != (int)uVar61);
              }
              uVar54 = uVar54 + 1;
              local_3e8 = local_3e8 + lVar23;
            } while (iVar32 + 1 != (int)uVar54);
          }
          bVar76 = uVar27 != uVar3;
          uVar27 = uVar27 + 1;
        } while (bVar76);
      }
      local_3f0 = local_3f0 + 1;
      local_30c = local_30c + 1;
    } while (local_3f0 != uVar74);
  }
  Gpu::Elixir::~Elixir((Elixir *)local_b8);
  local_98._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_98);
  Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&local_c8);
  return;
}

Assistant:

void
CellConservativeLinear::interp (const FArrayBox& crse,
                                int              crse_comp,
                                FArrayBox&       fine,
                                int              fine_comp,
                                int              ncomp,
                                const Box&       fine_region,
                                const IntVect&   ratio,
                                const Geometry&  crse_geom,
                                const Geometry&  fine_geom,
                                Vector<BCRec> const& bcr,
                                int              /*actual_comp*/,
                                int              /*actual_state*/,
                                RunOn             runon)
{
    BL_PROFILE("CellConservativeLinear::interp()");
    BL_ASSERT(bcr.size() >= ncomp);

    AMREX_ASSERT(fine.box().contains(fine_region));

    bool run_on_gpu = (runon == RunOn::Gpu && Gpu::inLaunchRegion());

    Box const& cdomain = crse_geom.Domain();
    amrex::ignore_unused(fine_geom);

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();

    const Box& crse_region = CoarseBox(fine_region,ratio);
    const Box& cslope_bx = amrex::grow(crse_region,-1);

    AsyncArray<BCRec> async_bcr(bcr.data(), (run_on_gpu) ? ncomp : 0);
    BCRec const* bcrp = (run_on_gpu) ? async_bcr.data() : bcr.data();

    FArrayBox ccfab(cslope_bx, ncomp*AMREX_SPACEDIM);
    Elixir cceli;
    if (run_on_gpu) cceli = ccfab.elixir();
    Array4<Real> const& tmp = ccfab.array();
    Array4<Real const> const& ctmp = ccfab.const_array();

#if (AMREX_SPACEDIM == 1)
    if (crse_geom.IsSPHERICAL()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(j,k);
                mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crsearr, crse_comp, ncomp,
                                                    cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(j,k);
            mf_cell_cons_lin_interp_sph(i, n, finearr, fine_comp, ctmp,
                                        crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#elif (AMREX_SPACEDIM == 2)
    if (crse_geom.IsRZ()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(k);
                mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crsearr, crse_comp, ncomp,
                                                   cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(k);
            mf_cell_cons_lin_interp_rz(i, j, n, finearr, fine_comp, ctmp,
                                       crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#endif
    {
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, ratio, bcrp);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            mf_cell_cons_lin_interp(i,j,k,n, finearr, fine_comp, ctmp,
                                    crsearr, crse_comp, ncomp, ratio);
        });
    }
}